

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O2

void Sbl_ManGetCurrentMapping(Sbl_Man_t *p)

{
  Vec_Wec_t *pVVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  word wVar4;
  word wVar5;
  word wVar6;
  word wVar7;
  int iVar8;
  ulong uVar9;
  
  Vec_WecClear(p->vWindow);
  pVVar1 = p->vWindow;
  iVar2 = p->vAnds->nSize;
  iVar8 = pVVar1->nCap;
  if (iVar8 < iVar2) {
    if (pVVar1->pArray == (Vec_Int_t *)0x0) {
      pVVar3 = (Vec_Int_t *)malloc((long)iVar2 << 4);
    }
    else {
      pVVar3 = (Vec_Int_t *)realloc(pVVar1->pArray,(long)iVar2 << 4);
      iVar8 = pVVar1->nCap;
    }
    pVVar1->pArray = pVVar3;
    memset(pVVar3 + iVar8,0,(long)(iVar2 - iVar8) << 4);
    pVVar1->nCap = iVar2;
  }
  pVVar1->nSize = iVar2;
  pVVar3 = p->vSolCur;
  iVar2 = pVVar3->nSize;
  if (0 < iVar2) {
    for (iVar8 = 0; iVar8 < iVar2; iVar8 = iVar8 + 1) {
      iVar2 = Vec_IntEntry(pVVar3,iVar8);
      wVar4 = Vec_WrdEntry(p->vCutsI1,iVar2);
      wVar5 = Vec_WrdEntry(p->vCutsI2,iVar2);
      wVar6 = Vec_WrdEntry(p->vCutsN1,iVar2);
      wVar7 = Vec_WrdEntry(p->vCutsN2,iVar2);
      iVar2 = Vec_IntEntry(p->vCutsObj,iVar2);
      pVVar3 = Vec_WecEntry(p->vWindow,iVar2);
      pVVar3->nSize = 0;
      for (uVar9 = 0; uVar9 != 0x40; uVar9 = uVar9 + 1) {
        if ((wVar4 >> (uVar9 & 0x3f) & 1) != 0) {
          iVar2 = Vec_IntEntry(p->vLeaves,(int)uVar9);
          Vec_IntPush(pVVar3,iVar2);
        }
      }
      for (uVar9 = 0; uVar9 != 0x40; uVar9 = uVar9 + 1) {
        if ((wVar5 >> (uVar9 & 0x3f) & 1) != 0) {
          iVar2 = Vec_IntEntry(p->vLeaves,(uint)uVar9 | 0x40);
          Vec_IntPush(pVVar3,iVar2);
        }
      }
      for (uVar9 = 0; uVar9 != 0x40; uVar9 = uVar9 + 1) {
        if ((wVar6 >> (uVar9 & 0x3f) & 1) != 0) {
          iVar2 = Vec_IntEntry(p->vAnds,(int)uVar9);
          Vec_IntPush(pVVar3,iVar2);
        }
      }
      for (uVar9 = 0; uVar9 != 0x40; uVar9 = uVar9 + 1) {
        if ((wVar7 >> (uVar9 & 0x3f) & 1) != 0) {
          iVar2 = Vec_IntEntry(p->vAnds,(uint)uVar9 | 0x40);
          Vec_IntPush(pVVar3,iVar2);
        }
      }
      pVVar3 = p->vSolCur;
      iVar2 = pVVar3->nSize;
    }
    return;
  }
  __assert_fail("Vec_IntSize(p->vSolCur) > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatLut.c"
                ,0x10c,"void Sbl_ManGetCurrentMapping(Sbl_Man_t *)");
}

Assistant:

void Sbl_ManGetCurrentMapping( Sbl_Man_t * p )
{
    Vec_Int_t * vObj;
    word CutI1, CutI2, CutN1, CutN2;
    int i, c, b, iObj;
    Vec_WecClear( p->vWindow );
    Vec_WecInit( p->vWindow, Vec_IntSize(p->vAnds) );
    assert( Vec_IntSize(p->vSolCur) > 0 );
    Vec_IntForEachEntry( p->vSolCur, c, i )
    {
        CutI1 = Vec_WrdEntry( p->vCutsI1, c );
        CutI2 = Vec_WrdEntry( p->vCutsI2, c );
        CutN1 = Vec_WrdEntry( p->vCutsN1, c );
        CutN2 = Vec_WrdEntry( p->vCutsN2, c );
        iObj  = Vec_IntEntry( p->vCutsObj, c );
        //iObj  = Vec_IntEntry( p->vAnds, iObj );
        vObj  = Vec_WecEntry( p->vWindow, iObj );
        Vec_IntClear( vObj );
        assert( Vec_IntSize(vObj) == 0 );
        for ( b = 0; b < 64; b++ )
            if ( (CutI1 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vLeaves, b) );
        for ( b = 0; b < 64; b++ )
            if ( (CutI2 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vLeaves, 64+b) );
        for ( b = 0; b < 64; b++ )
            if ( (CutN1 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vAnds, b) );
        for ( b = 0; b < 64; b++ )
            if ( (CutN2 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vAnds, 64+b) );
    }
}